

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O0

void Gia_ManFromBridgeCex(FILE *pFile,Abc_Cex_t *pCex)

{
  char Entry;
  int iVar1;
  Vec_Str_t *p;
  uchar *pBuffer;
  Vec_Str_t *vStr;
  int local_20;
  int iBit;
  int f;
  int i;
  Abc_Cex_t *pCex_local;
  FILE *pFile_local;
  
  p = Vec_StrAlloc(1000);
  Vec_StrPush(p,'\x02');
  Vec_StrPush(p,'\x01');
  Gia_AigerWriteUnsigned(p,pCex->iPo);
  Vec_StrPush(p,'\x01');
  Gia_AigerWriteUnsigned(p,pCex->iFrame);
  Gia_AigerWriteUnsigned(p,1);
  Gia_AigerWriteUnsigned(p,pCex->iFrame + 1);
  vStr._4_4_ = pCex->nRegs;
  for (local_20 = 0; local_20 <= pCex->iFrame; local_20 = local_20 + 1) {
    Gia_AigerWriteUnsigned(p,pCex->nPis);
    for (iBit = 0; iBit < pCex->nPis; iBit = iBit + 1) {
      iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),vStr._4_4_);
      Entry = '\x02';
      if (iVar1 != 0) {
        Entry = '\x03';
      }
      Vec_StrPush(p,Entry);
      vStr._4_4_ = vStr._4_4_ + 1;
    }
  }
  if (vStr._4_4_ == pCex->nBits) {
    Vec_StrPush(p,'\x01');
    Gia_AigerWriteUnsigned(p,pCex->nRegs);
    for (iBit = 0; iBit < pCex->nRegs; iBit = iBit + 1) {
      Vec_StrPush(p,'\x02');
    }
    iVar1 = Vec_StrSize(p);
    pBuffer = (uchar *)Vec_StrArray(p);
    Gia_CreateHeader(pFile,0x65,iVar1,pBuffer);
    Vec_StrFree(p);
    fflush((FILE *)pFile);
    return;
  }
  __assert_fail("iBit == pCex->nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                ,0x114,"void Gia_ManFromBridgeCex(FILE *, Abc_Cex_t *)");
}

Assistant:

void Gia_ManFromBridgeCex( FILE * pFile, Abc_Cex_t * pCex )
{
    int i, f, iBit;//, RetValue;
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_StrPush( vStr, (char)BRIDGE_VALUE_0 ); // false
    Vec_StrPush( vStr, (char)1 ); // size of vector (Armin's encoding)
    Gia_AigerWriteUnsigned( vStr, pCex->iPo ); // number of the property (Armin's encoding)
    Vec_StrPush( vStr, (char)1 ); // size of vector (Armin's encoding)
    Gia_AigerWriteUnsigned( vStr, pCex->iFrame ); // depth

    Gia_AigerWriteUnsigned( vStr, 1 ); // concrete
    Gia_AigerWriteUnsigned( vStr, pCex->iFrame + 1 ); // number of frames (1 more than depth)
    iBit = pCex->nRegs;
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Gia_AigerWriteUnsigned( vStr, pCex->nPis ); // num of inputs
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            Vec_StrPush( vStr, (char)(Abc_InfoHasBit(pCex->pData, iBit) ? BRIDGE_VALUE_1:BRIDGE_VALUE_0) ); // value
    }
    assert( iBit == pCex->nBits );
    Vec_StrPush( vStr, (char)1 ); // the number of frames (for a concrete counter-example)
    Gia_AigerWriteUnsigned( vStr, pCex->nRegs ); // num of flops
    for ( i = 0; i < pCex->nRegs; i++ )
        Vec_StrPush( vStr, (char)BRIDGE_VALUE_0 ); // always zero!!!
//    RetValue = fwrite( Vec_StrArray(vStr), Vec_StrSize(vStr), 1, pFile );
    Gia_CreateHeader(pFile, 101/*type=Result*/, Vec_StrSize(vStr), (unsigned char*)Vec_StrArray(vStr));

    Vec_StrFree( vStr );
    fflush(pFile);
}